

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O0

AccelerometerSensor * __thiscall
iDynTree::AccelerometerSensor::operator=(AccelerometerSensor *this,AccelerometerSensor *other)

{
  AccelerometerPrivateAttributes *in_RSI;
  AccelerometerPrivateAttributes *in_RDI;
  
  if (in_RDI != in_RSI) {
    AccelerometerPrivateAttributes::operator=(in_RSI,in_RDI);
  }
  return (AccelerometerSensor *)in_RDI;
}

Assistant:

AccelerometerSensor& AccelerometerSensor::operator=(const AccelerometerSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}